

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O3

void Of_ManCreateSat(Of_Man_t *p,int nCutsAll,Vec_Int_t *vFirst,Vec_Int_t *vCutNum,
                    Vec_Int_t *vBestNode,Vec_Int_t *vBestCut)

{
  int *piVar1;
  void *pvVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  int iVar5;
  Vec_Int_t *pVVar6;
  lit *begin;
  sat_solver *s;
  uint uVar7;
  Gia_Obj_t *pGVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  Vec_Int_t *pVVar12;
  char *__format;
  Gia_Man_t *pGVar13;
  int iVar14;
  uint uVar15;
  uint *puVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int Lit;
  int pLits [2];
  timespec ts;
  int local_7c;
  Vec_Int_t *local_78;
  int local_70;
  int local_6c;
  Vec_Int_t *local_68;
  Vec_Int_t *local_60;
  long local_58;
  timespec local_50;
  long local_40;
  int *local_38;
  
  local_60 = vCutNum;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  begin = (lit *)malloc(400);
  pVVar6->pArray = begin;
  iVar5 = clock_gettime(3,&local_50);
  if (iVar5 < 0) {
    local_58 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    local_58 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  s = sat_solver_new();
  pGVar13 = p->pGia;
  sat_solver_setnvars(s,pGVar13->nObjs + nCutsAll + ~(pGVar13->vCos->nSize + pGVar13->vCis->nSize));
  if (0 < vBestCut->nSize) {
    lVar10 = 0;
    do {
      Vec_IntPush(vBestNode,vBestCut->pArray[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 < vBestCut->nSize);
  }
  piVar1 = vBestNode->pArray;
  uVar15 = vBestNode->nSize;
  if (0 < s->size) {
    lVar10 = 0;
    do {
      s->polarity[lVar10] = '\0';
      lVar10 = lVar10 + 1;
    } while (lVar10 < s->size);
  }
  if (0 < (int)uVar15) {
    uVar11 = 0;
    do {
      s->polarity[piVar1[uVar11]] = '\x01';
      uVar11 = uVar11 + 1;
    } while (uVar15 != uVar11);
  }
  if (vBestCut->nSize < 0) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  vBestNode->nSize = vBestNode->nSize - vBestCut->nSize;
  pGVar13 = p->pGia;
  iVar5 = 0;
  local_78 = pVVar6;
  if (0 < pGVar13->nObjs) {
    pGVar8 = pGVar13->pObjs;
    local_68 = vBestNode;
    if (pGVar8 == (Gia_Obj_t *)0x0) {
      bVar3 = true;
    }
    else {
      lVar10 = 0;
      do {
        if ((~*(uint *)pGVar8 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar8) {
          if ((vFirst->nSize <= lVar10) || (local_60->nSize <= lVar10)) goto LAB_0079261c;
          iVar5 = vFirst->pArray[lVar10];
          iVar17 = local_60->pArray[lVar10];
          pVVar6->nSize = 0;
          if ((int)pGVar8->Value < 0) goto LAB_007925a0;
          Vec_IntPush(pVVar6,pGVar8->Value * 2 + 1);
          if (0 < iVar17) {
            iVar14 = iVar5 * 2;
            do {
              if (iVar5 < 0) goto LAB_007925a0;
              Vec_IntPush(local_78,iVar14);
              iVar14 = iVar14 + 2;
              iVar17 = iVar17 + -1;
            } while (iVar17 != 0);
          }
          pVVar6 = local_78;
          begin = local_78->pArray;
          iVar5 = sat_solver_addclause(s,begin,begin + local_78->nSize);
          if (iVar5 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                          ,0x606,
                          "void Of_ManCreateSat(Of_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                         );
          }
          pGVar13 = p->pGia;
        }
        lVar10 = lVar10 + 1;
      } while ((lVar10 < pGVar13->nObjs) &&
              (pGVar8 = pGVar13->pObjs + lVar10, pGVar13->pObjs != (Gia_Obj_t *)0x0));
      bVar3 = 0 < pGVar13->nObjs;
    }
    vBestNode = local_68;
    iVar5 = 0;
    if (bVar3) {
      lVar10 = 0;
      iVar5 = 0;
      do {
        if (pGVar13->pObjs == (Gia_Obj_t *)0x0) break;
        local_60 = (Vec_Int_t *)(pGVar13->pObjs + lVar10);
        if ((~local_60->nCap & 0x1fffffffU) != 0 && -1 < local_60->nCap) {
          if ((p->vCutSets).nSize <= lVar10) {
LAB_0079261c:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar15 = (p->vCutSets).pArray[lVar10];
          uVar9 = (int)uVar15 >> 0x10;
          if (((int)uVar9 < 0) || ((p->vPages).nSize <= (int)uVar9)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pvVar2 = (p->vPages).pArray[uVar9];
          uVar11 = (ulong)(uVar15 & 0xffff);
          vBestNode = local_68;
          if (0 < *(int *)((long)pvVar2 + uVar11 * 4)) {
            local_38 = (int *)((long)pvVar2 + uVar11 * 4);
            puVar16 = (uint *)(local_38 + 1);
            iVar17 = 0;
            local_40 = lVar10;
            do {
              pGVar13 = p->pGia;
              iVar14 = pGVar13->nObjs + iVar5 + ~(pGVar13->vCos->nSize + pGVar13->vCis->nSize);
              if (iVar14 < 0) goto LAB_007925a0;
              local_70 = iVar14 * 2 + 1;
              if (*(int *)&local_60->pArray < 0) goto LAB_007925a0;
              local_6c = *(int *)&local_60->pArray * 2;
              iVar14 = sat_solver_addclause(s,&local_70,(lit *)&local_68);
              if (iVar14 == 0) {
                __assert_fail("RetValue",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                              ,0x613,
                              "void Of_ManCreateSat(Of_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                             );
              }
              uVar15 = *puVar16;
              uVar11 = (ulong)(uVar15 & 0x1f);
              if ((uVar15 & 0x1f) == 0) {
                uVar11 = 4;
              }
              else {
                uVar18 = 0;
                do {
                  uVar7 = (uint)uVar11;
                  uVar9 = puVar16[uVar18 + 1];
                  if ((int)uVar9 < 0) {
                    __assert_fail("Lit >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                  ,0x12f,"int Abc_Lit2Var(int)");
                  }
                  if (uVar9 < 2) break;
                  uVar9 = uVar9 >> 1;
                  if (p->pGia->nObjs <= (int)uVar9) goto LAB_00792562;
                  pGVar8 = p->pGia->pObjs;
                  uVar7 = *(uint *)(pGVar8 + uVar9);
                  if ((~uVar7 & 0x1fffffff) != 0 && -1 < (int)uVar7) {
                    uVar15 = pGVar8[uVar9].Value;
                    if ((int)uVar15 < 0) goto LAB_007925a0;
                    local_6c = uVar15 * 2;
                    iVar14 = sat_solver_addclause(s,&local_70,(lit *)&local_68);
                    if (iVar14 == 0) {
                      __assert_fail("RetValue",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                                    ,0x61b,
                                    "void Of_ManCreateSat(Of_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                                   );
                    }
                    uVar15 = *puVar16;
                  }
                  uVar18 = uVar18 + 1;
                  uVar7 = uVar15 & 0x1f;
                  uVar11 = (ulong)uVar7;
                } while (uVar18 < uVar11);
                uVar11 = (ulong)(uVar7 + 4);
              }
              iVar5 = iVar5 + 1;
              iVar17 = iVar17 + 1;
              puVar16 = puVar16 + uVar11;
            } while (iVar17 < *local_38);
            pGVar13 = p->pGia;
            lVar10 = local_40;
            pVVar6 = local_78;
            vBestNode = local_68;
          }
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < pGVar13->nObjs);
    }
  }
  if (iVar5 != nCutsAll) {
    __assert_fail("nCutCount == nCutsAll",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                  ,0x620,
                  "void Of_ManCreateSat(Of_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  pVVar12 = pGVar13->vCos;
  if (0 < pVVar12->nSize) {
    lVar10 = 0;
    do {
      iVar5 = pVVar12->pArray[lVar10];
      if (((long)iVar5 < 0) || (pGVar13->nObjs <= iVar5)) goto LAB_00792562;
      if (pGVar13->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar8 = pGVar13->pObjs + iVar5;
      *(ulong *)(pGVar8 + -(ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff)) =
           *(ulong *)(pGVar8 + -(ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff)) | 0x40000000;
      lVar10 = lVar10 + 1;
      pGVar13 = p->pGia;
      pVVar12 = pGVar13->vCos;
    } while (lVar10 < pVVar12->nSize);
  }
  if (0 < pGVar13->nObjs) {
    lVar10 = 8;
    lVar19 = 0;
    do {
      pGVar8 = pGVar13->pObjs;
      if (pGVar8 == (Gia_Obj_t *)0x0) break;
      uVar15 = *(uint *)((long)pGVar8 + lVar10 + -8);
      if ((uVar15 & 0xc0000000) == 0x40000000 && (~uVar15 & 0x1fffffff) != 0) {
        if (*(int *)(&pGVar8->field_0x0 + lVar10) < 0) {
LAB_007925a0:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        local_7c = *(int *)(&pGVar8->field_0x0 + lVar10) * 2;
        iVar5 = sat_solver_addclause(s,&local_7c,(lit *)&local_78);
        if (iVar5 == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                        ,0x62b,
                        "void Of_ManCreateSat(Of_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        pGVar13 = p->pGia;
      }
      lVar19 = lVar19 + 1;
      lVar10 = lVar10 + 0xc;
    } while (lVar19 < pGVar13->nObjs);
  }
  pVVar12 = pGVar13->vCos;
  if (0 < pVVar12->nSize) {
    lVar10 = 0;
    do {
      iVar5 = pVVar12->pArray[lVar10];
      if (((long)iVar5 < 0) || (pGVar13->nObjs <= iVar5)) {
LAB_00792562:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar13->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar8 = pGVar13->pObjs + iVar5;
      *(ulong *)(pGVar8 + -(ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff)) =
           *(ulong *)(pGVar8 + -(ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff)) &
           0xffffffffbfffffff;
      lVar10 = lVar10 + 1;
      pGVar13 = p->pGia;
      pVVar12 = pGVar13->vCos;
    } while (lVar10 < pVVar12->nSize);
  }
  uVar15 = (s->stats).clauses;
  pVVar6->nSize = 0;
  uVar9 = ~(pVVar12->nSize + pGVar13->vCis->nSize) + pGVar13->nObjs;
  if (pVVar6->nCap < (int)uVar9) {
    if (begin == (lit *)0x0) {
      begin = (lit *)malloc((long)(int)uVar9 << 2);
    }
    else {
      begin = (lit *)realloc(begin,(long)(int)uVar9 << 2);
    }
    pVVar6->pArray = begin;
    if (begin == (lit *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar6->nCap = uVar9;
  }
  auVar4 = _DAT_0093d220;
  if (0 < (int)uVar9) {
    lVar10 = (ulong)uVar9 - 1;
    auVar20._8_4_ = (int)lVar10;
    auVar20._0_8_ = lVar10;
    auVar20._12_4_ = (int)((ulong)lVar10 >> 0x20);
    uVar11 = 0;
    auVar20 = auVar20 ^ _DAT_0093d220;
    auVar21 = _DAT_0093d210;
    do {
      auVar22 = auVar21 ^ auVar4;
      if ((bool)(~(auVar22._4_4_ == auVar20._4_4_ && auVar20._0_4_ < auVar22._0_4_ ||
                  auVar20._4_4_ < auVar22._4_4_) & 1)) {
        begin[uVar11] = (int)uVar11;
      }
      if ((auVar22._12_4_ != auVar20._12_4_ || auVar22._8_4_ <= auVar20._8_4_) &&
          auVar22._12_4_ <= auVar20._12_4_) {
        begin[uVar11 + 1] = (int)uVar11 + 1;
      }
      uVar11 = uVar11 + 2;
      lVar10 = auVar21._8_8_;
      auVar21._0_8_ = auVar21._0_8_ + 2;
      auVar21._8_8_ = lVar10 + 2;
    } while ((uVar9 + 1 & 0xfffffffe) != uVar11);
  }
  pVVar6->nSize = uVar9;
  bVar3 = false;
  Cnf_AddCardinConstrPairWise(s,pVVar6,vBestNode->nSize + -2,0);
  printf("Problem clauses = %d.  Cardinality clauses = %d.\n",(ulong)uVar15,
         (ulong)((s->stats).clauses - uVar15));
  iVar5 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,1000000,0,0,0);
  if (iVar5 == -1) {
    __format = "Unsatisfiable. ";
    bVar3 = false;
  }
  else if (iVar5 == 0) {
    __format = "Undecided.  ";
    bVar3 = false;
  }
  else {
    if (iVar5 != 1) goto LAB_00792331;
    __format = "Satisfiable.  ";
    bVar3 = true;
  }
  printf(__format);
LAB_00792331:
  iVar17 = 3;
  iVar5 = clock_gettime(3,&local_50);
  if (iVar5 < 0) {
    lVar10 = -1;
  }
  else {
    lVar10 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  lVar10 = lVar10 + local_58;
  uVar11 = 0;
  Abc_Print(iVar17,"%s =","Time");
  Abc_Print(iVar17,"%9.2f sec\n",(double)lVar10 / 1000000.0);
  Sat_SolverPrintStats(_stdout,s);
  if (bVar3) {
    pGVar13 = p->pGia;
    uVar15 = 0;
    if ((pGVar13->vCos->nSize + pGVar13->vCis->nSize) - pGVar13->nObjs < -1) {
      uVar18 = (ulong)(uint)s->size;
      uVar11 = 0;
      uVar15 = 0;
      do {
        if ((long)(int)uVar18 <= (long)uVar11) goto LAB_007925fd;
        printf("%d",(ulong)(s->model[uVar11] == 1));
        uVar18 = (ulong)s->size;
        if ((long)uVar18 <= (long)uVar11) goto LAB_007925fd;
        uVar15 = uVar15 + (s->model[uVar11] == 1);
        uVar11 = uVar11 + 1;
        pGVar13 = p->pGia;
      } while ((long)uVar11 <
               (long)(~(pGVar13->vCos->nSize + pGVar13->vCis->nSize) + pGVar13->nObjs));
    }
    uVar9 = 0;
    printf(" Nodes = %d\n",(ulong)uVar15);
    pGVar13 = p->pGia;
    if ((int)uVar11 < pGVar13->nObjs + nCutsAll + ~(pGVar13->vCos->nSize + pGVar13->vCis->nSize)) {
      uVar11 = uVar11 & 0xffffffff;
      uVar18 = (ulong)(uint)s->size;
      uVar9 = 0;
      do {
        if ((long)(int)uVar18 <= (long)uVar11) {
LAB_007925fd:
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                        ,0xda,"int sat_solver_var_value(sat_solver *, int)");
        }
        printf("%d",(ulong)(s->model[uVar11] == 1));
        uVar18 = (ulong)s->size;
        if ((long)uVar18 <= (long)uVar11) goto LAB_007925fd;
        uVar9 = uVar9 + (s->model[uVar11] == 1);
        uVar11 = uVar11 + 1;
        pGVar13 = p->pGia;
      } while ((int)uVar11 <
               pGVar13->nObjs + nCutsAll + ~(pGVar13->vCos->nSize + pGVar13->vCis->nSize));
    }
    printf(" LUTs = %d\n",(ulong)uVar9);
  }
  sat_solver_delete(s);
  pVVar6 = local_78;
  if (local_78->pArray != (int *)0x0) {
    free(local_78->pArray);
  }
  free(pVVar6);
  return;
}

Assistant:

void Of_ManCreateSat( Of_Man_t * p, int nCutsAll, Vec_Int_t * vFirst, Vec_Int_t * vCutNum, Vec_Int_t * vBestNode, Vec_Int_t * vBestCut )
{
    extern void Cnf_AddCardinConstrPairWise( sat_solver * p, Vec_Int_t * vVars, int K, int fStrict );

    Gia_Obj_t * pObj, * pVar;
    int * pCutSet, * pCut;
    int i, k, v, c, Var, Lit, pLits[2], status, RetValue, nCutCount, nClauses;
    Vec_Int_t * vLits = Vec_IntAlloc( 100 );
    abctime clk = Abc_Clock();

    // start solver
    sat_solver * pSat = sat_solver_new();
    sat_solver_setnvars( pSat, Gia_ManAndNum(p->pGia) + nCutsAll );

    // set polarity
    Vec_IntAppend( vBestNode, vBestCut );
    //Vec_IntPrint( vBestNode );
    sat_solver_set_polarity( pSat, Vec_IntArray(vBestNode), Vec_IntSize(vBestNode) );
    Vec_IntShrink( vBestNode, Vec_IntSize(vBestNode) - Vec_IntSize(vBestCut) );

    // add clauses for nodes
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        int iFirst = Vec_IntEntry(vFirst, i);
        int nCuts = Vec_IntEntry(vCutNum, i);
        Vec_IntClear( vLits );
        Vec_IntPush( vLits, Abc_Var2Lit(pObj->Value, 1) );
        for ( c = 0; c < nCuts; c++ )
            Vec_IntPush( vLits, Abc_Var2Lit(iFirst + c, 0) );
        RetValue = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits) );
        assert( RetValue );
    }

    // add clauses for cuts
    nCutCount = 0;
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        pCutSet = Of_ObjCutSet(p, i);
        Of_SetForEachCut( pCutSet, pCut, k )
        {
            pLits[0] = Abc_Var2Lit( Gia_ManAndNum(p->pGia) + nCutCount, 1 );
            pLits[1] = Abc_Var2Lit( pObj->Value, 0 );
            RetValue = sat_solver_addclause( pSat, pLits, pLits+2 );
            assert( RetValue );
            Of_CutForEachVar( pCut, Var, v )
            {
                pVar = Gia_ManObj(p->pGia, Var);
                if ( !Gia_ObjIsAnd(pVar) )
                    continue;
                pLits[1] = Abc_Var2Lit( pVar->Value, 0 );
                RetValue = sat_solver_addclause( pSat, pLits, pLits+2 );
                assert( RetValue );
            }
            nCutCount++;
        }
    }
    assert( nCutCount == nCutsAll );

    // mark CO drivers
    Gia_ManForEachCo( p->pGia, pObj, i )
        Gia_ObjFanin0(pObj)->fMark0 = 1;
    // set used nodes to 1
    Gia_ManForEachAnd( p->pGia, pObj, i )
        if ( pObj->fMark0 )
        {
            Lit = Abc_Var2Lit( pObj->Value, 0 );
            RetValue = sat_solver_addclause( pSat, &Lit, &Lit + 1 );
            assert( RetValue );
        }
    // unmark CO drivers
    Gia_ManForEachCo( p->pGia, pObj, i )
        Gia_ObjFanin0(pObj)->fMark0 = 0;

//    Sat_SolverWriteDimacs( pSat, "temp.cnf", NULL, NULL, 0 );

    // add cardinality constraint
    nClauses = pSat->stats.clauses;
    Vec_IntClear( vLits );
    Vec_IntFillNatural( vLits, Gia_ManAndNum(p->pGia) );
    Cnf_AddCardinConstrPairWise( pSat, vLits, Vec_IntSize(vBestNode)-2, 0 );
    printf( "Problem clauses = %d.  Cardinality clauses = %d.\n", nClauses, pSat->stats.clauses - nClauses );

    // solve the problem
    status = sat_solver_solve( pSat, NULL, NULL, 1000000, 0, 0, 0 );
    if ( status == l_Undef )
        printf( "Undecided.  " );
    if ( status == l_True )
        printf( "Satisfiable.  " );
    if ( status == l_False )
        printf( "Unsatisfiable. " );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Sat_SolverPrintStats( stdout, pSat );
    if ( status == l_True )
    {
        int nOnes = 0;
        for ( v = 0; v < Gia_ManAndNum(p->pGia); v++ )
        {
            printf( "%d", sat_solver_var_value(pSat, v) );
            nOnes += sat_solver_var_value(pSat, v);
        }
        printf( " Nodes = %d\n", nOnes );

        nOnes = 0;
        for ( ; v < Gia_ManAndNum(p->pGia) + nCutsAll; v++ )
        {
            printf( "%d", sat_solver_var_value(pSat, v) );
            nOnes += sat_solver_var_value(pSat, v);
        }
        printf( " LUTs = %d\n", nOnes );
    }

    // cleanup
    sat_solver_delete( pSat );
    Vec_IntFree( vLits );
}